

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QFormLayout::itemAt(QFormLayout *this,int row,ItemRole role)

{
  QFormLayoutItem *pQVar1;
  uint uVar2;
  QFormLayoutItem **ppQVar3;
  uint in_EDX;
  uint in_ESI;
  QFormLayoutItem *item_1;
  QFormLayoutItem *item;
  QFormLayoutPrivate *d;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *in_stack_ffffffffffffffd0;
  
  d_func((QFormLayout *)0x4b7dbf);
  uVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                    ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b7ddd);
  if (in_ESI < uVar2) {
    if (in_EDX < 2) {
      ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (in_stack_ffffffffffffffd0,in_ESI,in_EDX);
      if (*ppQVar3 != (QFormLayoutItem *)0x0) {
        return (*ppQVar3)->item;
      }
    }
    else if (in_EDX == 2) {
      ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (in_stack_ffffffffffffffd0,in_ESI,2);
      pQVar1 = *ppQVar3;
      if ((pQVar1 != (QFormLayoutItem *)0x0) && ((pQVar1->fullRow & 1U) != 0)) {
        return pQVar1->item;
      }
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QFormLayout::itemAt(int row, ItemRole role) const
{
    Q_D(const QFormLayout);
    if (uint(row) >= uint(d->m_matrix.rowCount()))
        return nullptr;
    switch (role) {
    case SpanningRole:
        if (QFormLayoutItem *item = d->m_matrix(row, 1))
            if (item->fullRow)
                return item->item;
        break;
    case LabelRole:
    case FieldRole:
        if (QFormLayoutItem *item = d->m_matrix(row, (role == LabelRole) ? 0 : 1))
            return item->item;
        break;
    }
    return nullptr;
}